

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

int hi0bits(uint32 x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = x << 0x10;
  if (x >= 0x10000) {
    uVar2 = x;
  }
  iVar4 = (uint)(x < 0x10000) * 0x10;
  uVar1 = uVar2 << 8;
  if (0xffffff < uVar2) {
    uVar1 = uVar2;
  }
  iVar3 = iVar4 + 8;
  if (0xffffff < uVar2) {
    iVar3 = iVar4;
  }
  uVar2 = uVar1 << 4;
  if (0xfffffff < uVar1) {
    uVar2 = uVar1;
  }
  iVar4 = iVar3 + 4;
  if (0xfffffff < uVar1) {
    iVar4 = iVar3;
  }
  uVar1 = uVar2 * 4;
  if (0x3fffffff < uVar2) {
    uVar1 = uVar2;
  }
  iVar3 = iVar4 + 2;
  if (0x3fffffff < uVar2) {
    iVar3 = iVar4;
  }
  iVar4 = 0x20;
  if (0x3fffffff < uVar1) {
    iVar4 = iVar3 + 1;
  }
  if ((int)uVar1 < 0) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

static int
hi0bits(ULong x)
{
    int k = 0;

    if (!(x & 0xffff0000)) {
        k = 16;
        x <<= 16;
    }
    if (!(x & 0xff000000)) {
        k += 8;
        x <<= 8;
    }
    if (!(x & 0xf0000000)) {
        k += 4;
        x <<= 4;
    }
    if (!(x & 0xc0000000)) {
        k += 2;
        x <<= 2;
    }
    if (!(x & 0x80000000)) {
        k++;
        if (!(x & 0x40000000))
            return 32;
    }
    return k;
}